

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter-mip-test.h
# Opt level: O2

void __thiscall
mip_converter_test::MIPInstanceBackend::SetLinearObjective
          (MIPInstanceBackend *this,int param_1,LinearObjective *lo)

{
  SparseVec lin_part;
  SparseVec local_e8;
  _Vector_base<int,_std::allocator<int>_> local_b8;
  _Vector_base<double,_std::allocator<double>_> local_a0;
  Objective local_88;
  ArrayRef<int> local_48;
  
  local_88.le_.c_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (lo->lt_).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
       super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
  local_88.le_.v_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(lo->lt_).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_size;
  local_88.le_.c_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.sense_ = minimize_;
  local_88._4_4_ = 0;
  local_88.le_.c_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mp::ArrayRef<double>::move_or_copy
            ((vector<double,_std::allocator<double>_> *)&local_a0,(ArrayRef<double> *)&local_88);
  local_48.data_ =
       (lo->lt_).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
       super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
  local_48.size_ =
       (lo->lt_).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
       super_small_vector_data_base<int_*,_unsigned_long>.m_size;
  local_48.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  mp::ArrayRef<int>::move_or_copy((vector<int,_std::allocator<int>_> *)&local_b8,&local_48);
  MIPInstance::SparseVec::SparseVec
            (&local_e8,(vector<double,_std::allocator<double>_> *)&local_a0,
             (vector<int,_std::allocator<int>_> *)&local_b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_88);
  local_88.sense_ = lo->sense_;
  local_88.le_.c_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_e8.c_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_88.le_.c_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_e8.c_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_88.le_.c_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_e8.c_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_e8.c_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e8.c_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e8.c_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.le_.v_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = local_e8.v_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_88.le_.v_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_e8.v_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_88.le_.v_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_e8.v_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_e8.v_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_e8.v_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e8.v_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  vector<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>
  ::emplace_back<mip_converter_test::MIPInstance::Objective>(&(this->instance_).objs_,&local_88);
  MIPInstance::SparseVec::~SparseVec(&local_88.le_);
  MIPInstance::SparseVec::~SparseVec(&local_e8);
  return;
}

Assistant:

void SetLinearObjective(int , const mp::LinearObjective& lo) {
    mip_converter_test::MIPInstance::SparseVec lin_part {lo.coefs(), lo.vars()};
    instance_.objs_.push_back({(Sense)lo.obj_sense(),
                              std::move(lin_part)});
  }